

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateProfiledNewScArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef,uint32 length)

{
  Func *func;
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  uint sourceContextId;
  uint functionId;
  BOOL BVar4;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  LabelInstr *helperLabel;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  AddrOpnd *pAVar7;
  IndirOpnd *pIVar8;
  intptr_t pMemLoc;
  MemRefOpnd *src;
  RegOpnd *pRVar9;
  LabelInstr *target;
  ArrayCallSiteInfo *arrayInfo_00;
  ArrayCallSiteInfo *arrayInfo_01;
  int iVar10;
  undefined1 local_78 [8];
  AutoReuseOpnd autoReuseHeadOpnd;
  uint32 local_38;
  bool local_31;
  uint32 size;
  bool isZeroed;
  
  autoReuseHeadOpnd._16_8_ = arrayInfo;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,ArrayCtorFastPathPhase,sourceContextId,functionId);
  if ((bVar2) || (DAT_0159ef99 != '\0')) {
LAB_005c2b94:
    bVar2 = false;
  }
  else {
    func = this->m_func;
    helperLabel = IR::LabelInstr::New(Label,func,true);
    pRVar9 = (RegOpnd *)instr->m_dst;
    local_38 = length;
    OVar3 = IR::Opnd::GetKind((Opnd *)pRVar9);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (instr->m_dst == (Opnd *)0x0) {
LAB_005c2e9c:
      BVar4 = IsSmallObject<Js::JavascriptArray>(this,length);
      if (BVar4 == 0) goto LAB_005c2b94;
      pRVar9 = GenerateArrayAllocHelper<Js::JavascriptArray>
                         (this,instr,&local_38,(ArrayCallSiteInfo *)autoReuseHeadOpnd._16_8_,
                          &local_31,false,false);
      local_78 = (undefined1  [8])0x0;
      IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_78,&pRVar9->super_Opnd,func,true);
      if (length < local_38) {
        iVar10 = length * 8 + 0x18;
        do {
          pAVar7 = IR::AddrOpnd::New(&DAT_40002fff80002,AddrOpndKindConstantAddress,this->m_func,
                                     true,(Var)0x0);
          pIVar8 = IR::IndirOpnd::New(pRVar9,iVar10,(pAVar7->super_Opnd).m_type,this->m_func,false);
          InsertMove(&pIVar8->super_Opnd,&pAVar7->super_Opnd,instr,true);
          length = length + 1;
          iVar10 = iVar10 + 8;
        } while (length < local_38);
      }
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_78);
    }
    else {
      local_78._0_2_ = (instr->m_dst->m_valueType).field_0.bits;
      bVar2 = ValueType::IsLikelyNativeIntArray((ValueType *)local_78);
      if (!bVar2) {
        if (instr->m_dst != (Opnd *)0x0) {
          local_78._0_2_ = (instr->m_dst->m_valueType).field_0.bits;
          bVar2 = ValueType::IsLikelyNativeFloatArray((ValueType *)local_78);
          if (bVar2) {
            BVar4 = IsSmallObject<Js::JavascriptNativeFloatArray>(this,length);
            if (BVar4 == 0) goto LAB_005c2b94;
            GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
                      (this,instr,arrayInfo_01,arrayInfoAddr,helperLabel);
            pRVar6 = GenerateArrayAllocHelper<Js::JavascriptNativeFloatArray>
                               (this,instr,&local_38,(ArrayCallSiteInfo *)autoReuseHeadOpnd._16_8_,
                                &local_31,false,false);
            local_78 = (undefined1  [8])0x0;
            IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_78,&pRVar6->super_Opnd,func,true);
            pAVar7 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,
                                       this->m_func,false,(Var)0x0);
            pIVar8 = IR::IndirOpnd::New(pRVar9,0x38,(pAVar7->super_Opnd).m_type,this->m_func,false);
            InsertMove(&pIVar8->super_Opnd,&pAVar7->super_Opnd,instr,true);
            if (length < local_38) {
              iVar10 = length * 8 + 0x18;
              do {
                func_00 = this->m_func;
                pMemLoc = ThreadContextInfo::GetNativeFloatArrayMissingItemAddr
                                    (func_00->m_threadContextInfo);
                src = IR::MemRefOpnd::New(pMemLoc,TyFloat64,func_00,AddrOpndKindDynamicMisc);
                pIVar8 = IR::IndirOpnd::New(pRVar6,iVar10,(src->super_Opnd).m_type,this->m_func,
                                            false);
                InsertMove(&pIVar8->super_Opnd,&src->super_Opnd,instr,true);
                length = length + 1;
                iVar10 = iVar10 + 8;
              } while (length < local_38);
            }
            goto LAB_005c2e8e;
          }
        }
        goto LAB_005c2e9c;
      }
      BVar4 = IsSmallObject<Js::JavascriptNativeIntArray>(this,length);
      if (BVar4 == 0) goto LAB_005c2b94;
      GenerateArrayInfoIsNativeIntArrayTest(this,instr,arrayInfo_00,arrayInfoAddr,helperLabel);
      pRVar6 = GenerateArrayAllocHelper<Js::JavascriptNativeIntArray>
                         (this,instr,&local_38,(ArrayCallSiteInfo *)autoReuseHeadOpnd._16_8_,
                          &local_31,false,false);
      local_78 = (undefined1  [8])0x0;
      IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_78,&pRVar6->super_Opnd,func,true);
      pAVar7 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                 false,(Var)0x0);
      pIVar8 = IR::IndirOpnd::New(pRVar9,0x38,(pAVar7->super_Opnd).m_type,this->m_func,false);
      InsertMove(&pIVar8->super_Opnd,&pAVar7->super_Opnd,instr,true);
      if (length < local_38) {
        iVar10 = length * 4 + 0x18;
        do {
          GenerateMemInit(this,pRVar6,iVar10,-0x7fffe,instr,local_31);
          length = length + 1;
          iVar10 = iVar10 + 4;
        } while (length < local_38);
      }
LAB_005c2e8e:
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_78);
    }
    target = IR::LabelInstr::New(Label,func,false);
    InsertBranch(Br,false,target,instr);
    IR::Instr::InsertBefore(instr,&helperLabel->super_Instr);
    IR::Instr::InsertAfter(instr,&target->super_Instr);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
Lowerer::GenerateProfiledNewScArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef, uint32 length)
{
    if (PHASE_OFF(Js::ArrayCtorFastPathPhase, m_func) || CONFIG_FLAG(ForceES5Array))
    {
        return false;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    uint32 size = length;
    bool isZeroed;
    IR::RegOpnd *dstOpnd = instr->GetDst()->AsRegOpnd();
    IR::RegOpnd *headOpnd;
    uint32 i = length;

    if (instr->GetDst() && instr->GetDst()->GetValueType().IsLikelyNativeIntArray())
    {
        if (!IsSmallObject<Js::JavascriptNativeIntArray>(length))
        {
            return false;
        }
        GenerateArrayInfoIsNativeIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeIntArray>(instr, &size, arrayInfo, &isZeroed);
        const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);
        for (; i < size; i++)
        {
            GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
                Js::JavascriptNativeIntArray::MissingItem, instr, isZeroed);
        }
    }
    else if (instr->GetDst() && instr->GetDst()->GetValueType().IsLikelyNativeFloatArray())
    {
        if (!IsSmallObject<Js::JavascriptNativeFloatArray>(length))
        {
            return false;
        }
        GenerateArrayInfoIsNativeFloatAndNotIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeFloatArray>(instr, &size, arrayInfo, &isZeroed);
        const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);
        // Js::JavascriptArray::MissingItem is a Var, so it may be 32-bit or 64 bit.
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        for (; i < size; i++)
        {
            GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(double),
                GetMissingItemOpndForAssignment(TyFloat64, m_func),
                instr, isZeroed);
        }
    }
    else
    {
        if (!IsSmallObject<Js::JavascriptArray>(length))
        {
            return false;
        }
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptArray>(instr, &size, arrayInfo, &isZeroed);
        const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);
        for (; i < size; i++)
        {
            GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(Js::Var),
                GetMissingItemOpndForAssignment(TyVar, m_func),
                instr, isZeroed);
        }
    }

    // Skip pass the helper call
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
    return true;
}